

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nl-reader.h
# Opt level: O0

void __thiscall
mp::internal::NLReader<mp::internal::BinaryReader<mp::internal::IdentityConverter>,_TestNLHandler2>
::ReadLogicalExpr(NLReader<mp::internal::BinaryReader<mp::internal::IdentityConverter>,_TestNLHandler2>
                  *this)

{
  TestNLHandler2 *this_00;
  char cVar1;
  BinaryReaderBase *in_RDI;
  double dVar2;
  CStringRef unaff_retaddr;
  char c;
  int in_stack_0000004c;
  NLReader<mp::internal::BinaryReader<mp::internal::IdentityConverter>,_TestNLHandler2>
  *in_stack_00000050;
  char in_stack_ffffffffffffffef;
  undefined7 in_stack_fffffffffffffff0;
  BinaryReaderBase *this_01;
  
  this_01 = in_RDI;
  cVar1 = ReaderBase::ReadChar((ReaderBase *)(in_RDI->super_ReaderBase).ptr_);
  switch((NLReader<mp::internal::BinaryReader<mp::internal::IdentityConverter>,_TestNLHandler2> *)
         (ulong)((int)cVar1 - 0x6c)) {
  case (NLReader<mp::internal::BinaryReader<mp::internal::IdentityConverter>,_TestNLHandler2> *)0x0:
  case (NLReader<mp::internal::BinaryReader<mp::internal::IdentityConverter>,_TestNLHandler2> *)0x2:
  case (NLReader<mp::internal::BinaryReader<mp::internal::IdentityConverter>,_TestNLHandler2> *)0x7:
    this_00 = (TestNLHandler2 *)(in_RDI->super_ReaderBase).end_;
    dVar2 = ReadConstant((NLReader<mp::internal::BinaryReader<mp::internal::IdentityConverter>,_TestNLHandler2>
                          *)CONCAT17(cVar1,in_stack_fffffffffffffff0),in_stack_ffffffffffffffef);
    TestNLHandler2::OnBool(this_00,dVar2 != 0.0);
    break;
  default:
    fmt::BasicCStringRef<char>::BasicCStringRef
              ((BasicCStringRef<char> *)&stack0xffffffffffffffe8,"expected logical expression");
    BinaryReaderBase::ReportError<>(this_01,unaff_retaddr);
    break;
  case (NLReader<mp::internal::BinaryReader<mp::internal::IdentityConverter>,_TestNLHandler2> *)0x3:
    ReadOpCode((NLReader<mp::internal::BinaryReader<mp::internal::IdentityConverter>,_TestNLHandler2>
                *)(ulong)((int)cVar1 - 0x6c));
    ReadLogicalExpr(in_stack_00000050,in_stack_0000004c);
  }
  return;
}

Assistant:

typename Handler::LogicalExpr NLReader<Reader, Handler>::ReadLogicalExpr() {
  switch (char c = reader_.ReadChar()) {
  case 'n': case 'l': case 's':
    return handler_.OnBool(ReadConstant(c) != 0);
  case 'o':
    return ReadLogicalExpr(ReadOpCode());
  }
  reader_.ReportError("expected logical expression");
  return LogicalExpr();
}